

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,string *item)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  char *pcVar3;
  Snapshot snapshot;
  bool bVar4;
  ostream *poVar5;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string fw;
  string fw_path;
  string full_fw;
  cmOutputConverter converter;
  ostringstream e;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  undefined1 local_1d8 [32];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  PositionType local_1a8;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  bool local_180;
  cmTarget *local_178;
  ios_base local_130 [264];
  
  bVar4 = cmsys::RegularExpression::find(&this->SplitFramework,(item->_M_dataplus)._M_p);
  if (bVar4) {
    pcVar3 = (this->SplitFramework).startp[1];
    if (pcVar3 == (char *)0x0) {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      local_218._M_string_length = 0;
      local_218.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,pcVar3,(this->SplitFramework).endp[1]);
    }
    pcVar3 = (this->SplitFramework).startp[2];
    paVar1 = &local_238.field_2;
    local_238._M_dataplus._M_p = (pointer)paVar1;
    if (pcVar3 == (char *)0x0) {
      local_238._M_string_length = 0;
      local_238.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,pcVar3,(this->SplitFramework).endp[2]);
    }
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_218._M_dataplus._M_p,
               local_218._M_dataplus._M_p + local_218._M_string_length);
    std::__cxx11::string::append((char *)&local_1f8);
    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_238._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_1f8);
    std::__cxx11::string::append((char *)&local_1f8);
    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_238._M_dataplus._M_p);
    pVar6 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->FrameworkPathsEmmitted,&local_218);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->FrameworkPaths,&local_218);
    }
    AddLibraryRuntimeInfo(this,&local_1f8);
    local_1d8._0_8_ = (cmState *)(local_1d8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"-framework","");
    pp_Var2 = (_func_int **)(local_1a0 + 0x10);
    local_1a0._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,local_1d8._0_8_,
               &(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                   *)local_1d8._0_8_)->_M_t)._M_impl.field_0x0 +
               (long)&(((vector<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
                         *)local_1d8._8_8_)->
                      super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
                      )._M_impl.super__Vector_impl_data._M_start);
    local_180 = false;
    local_178 = (cmTarget *)0x0;
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,(Item *)local_1a0);
    if ((_func_int **)local_1a0._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a0._0_8_,local_190._M_allocated_capacity + 1);
    }
    if ((cmState *)local_1d8._0_8_ != (cmState *)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    cmMakefile::GetStateSnapshot(this->Makefile);
    snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)uStack_1b0;
    snapshot.State = (cmState *)local_1b8;
    snapshot.Position.Position = local_1a8;
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_1d8,snapshot);
    cmOutputConverter::EscapeForShell
              ((string *)local_1a0,(cmOutputConverter *)local_1d8,&local_238,false,false,false);
    std::__cxx11::string::operator=((string *)&local_238,(string *)local_1a0);
    if ((_func_int **)local_1a0._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a0._0_8_,local_190._M_allocated_capacity + 1);
    }
    local_1a0._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,local_238._M_dataplus._M_p,
               local_238._M_dataplus._M_p + local_238._M_string_length);
    local_180 = false;
    local_178 = (cmTarget *)0x0;
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,(Item *)local_1a0);
    if ((_func_int **)local_1a0._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a0._0_8_,local_190._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar1) {
      operator_delete(local_238._M_dataplus._M_p,
                      CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                               local_238.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                               local_218.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Could not parse framework path \"",0x20);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(item->_M_dataplus)._M_p,item->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"linked by target ",0x11);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->Target->Name)._M_dataplus._M_p,
                        (this->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(local_218._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                               local_218.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(std::string const& item)
{
  // Try to separate the framework name and path.
  if(!this->SplitFramework.find(item.c_str()))
    {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" "
      << "linked by target " << this->Target->GetName() << ".";
    cmSystemTools::Error(e.str().c_str());
    return;
    }

  std::string fw_path = this->SplitFramework.match(1);
  std::string fw = this->SplitFramework.match(2);
  std::string full_fw = fw_path;
  full_fw += "/";
  full_fw += fw;
  full_fw += ".framework";
  full_fw += "/";
  full_fw += fw;

  // Add the directory portion to the framework search path.
  this->AddFrameworkPath(fw_path);

  // add runtime information
  this->AddLibraryRuntimeInfo(full_fw);

  // Add the item using the -framework option.
  this->Items.push_back(Item("-framework", false));
  cmOutputConverter converter(this->Makefile->GetStateSnapshot());
  fw = converter.EscapeForShell(fw);
  this->Items.push_back(Item(fw, false));
}